

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O3

size_t __thiscall MallocBlock::actual_data_size(MallocBlock *this,void *raw_ptr)

{
  LogItem b;
  LogItem b_00;
  LogItem b_01;
  LogItem c;
  LogItem c_00;
  LogItem c_01;
  LogItem d;
  LogItem d_00;
  LogItem d_01;
  void *pvVar1;
  undefined4 uStack_94;
  anon_union_8_4_e5b1a622_for_u_ aStack_90;
  undefined4 uStack_84;
  anon_union_8_4_e5b1a622_for_u_ aStack_80;
  undefined4 uStack_74;
  anon_union_8_4_e5b1a622_for_u_ aStack_70;
  undefined4 uStack_64;
  anon_union_8_4_e5b1a622_for_u_ aStack_60;
  undefined4 uStack_54;
  anon_union_8_4_e5b1a622_for_u_ aStack_50;
  undefined4 uStack_44;
  anon_union_8_4_e5b1a622_for_u_ aStack_40;
  undefined4 uStack_34;
  anon_union_8_4_e5b1a622_for_u_ aStack_30;
  undefined4 uStack_24;
  anon_union_8_4_e5b1a622_for_u_ aStack_20;
  undefined4 uStack_14;
  anon_union_8_4_e5b1a622_for_u_ aStack_10;
  
  if ((long)this->size1_ < 0) {
    d_00._4_4_ = uStack_74;
    d_00.tag_ = 4;
    c_00._4_4_ = uStack_84;
    c_00.tag_ = 4;
    b_00._4_4_ = uStack_94;
    b_00.tag_ = 4;
    b_00.u_.str = aStack_90.str;
    c_00.u_.str = aStack_80.str;
    d_00.u_.str = aStack_70.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/debugallocation.cc"
                  ,0x1f1,(LogItem)(ZEXT816(0x1334ba) << 0x40),b_00,c_00,d_00);
    do {
    } while( true );
  }
  if (raw_ptr < this->size_and_magic2_) {
    d._4_4_ = uStack_44;
    d.tag_ = 4;
    c._4_4_ = uStack_54;
    c.tag_ = 4;
    b._4_4_ = uStack_64;
    b.tag_ = 4;
    b.u_.str = aStack_60.str;
    c.u_.str = aStack_50.str;
    d.u_.str = aStack_40.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/debugallocation.cc"
                  ,0x1f2,(LogItem)(ZEXT816(0x1334cf) << 0x40),b,c,d);
    do {
    } while( true );
  }
  pvVar1 = (void *)((long)this->size_and_magic2_ + this->size1_);
  if (pvVar1 < raw_ptr) {
    d_01._4_4_ = uStack_14;
    d_01.tag_ = 4;
    c_01._4_4_ = uStack_24;
    c_01.tag_ = 4;
    b_01._4_4_ = uStack_34;
    b_01.tag_ = 4;
    b_01.u_.str = aStack_30.str;
    c_01.u_.str = aStack_20.str;
    d_01.u_.str = aStack_10.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/debugallocation.cc"
                  ,499,(LogItem)(ZEXT816(0x1334e4) << 0x40),b_01,c_01,d_01);
    do {
    } while( true );
  }
  return (long)pvVar1 - (long)raw_ptr;
}

Assistant:

size_t actual_data_size(const void* raw_ptr) const {
    const char* raw_begin = static_cast<const char*>(data_addr());
    const char* raw_end = raw_begin + raw_data_size();
    CHECK_CONDITION(raw_begin <= raw_end);
    CHECK_CONDITION(raw_begin <= raw_ptr);
    CHECK_CONDITION(raw_ptr <= raw_end);

    return raw_end - static_cast<const char*>(raw_ptr);
  }